

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O1

ON_ClippingPlaneDataStore * __thiscall
ON_ClippingPlaneDataStore::operator=(ON_ClippingPlaneDataStore *this,ON_ClippingPlaneDataStore *src)

{
  ON_ClippingPlaneData *pOVar1;
  ON_ClippingPlaneData *pOVar2;
  
  if ((src->m_sn != 0) &&
     (pOVar1 = GetClippingPlaneData(src->m_sn), pOVar1 != (ON_ClippingPlaneData *)0x0)) {
    pOVar2 = GetClippingPlaneData(this,SUB81(src,0));
    if (pOVar2 == (ON_ClippingPlaneData *)0x0) {
      return this;
    }
    pOVar2->m_depth = pOVar1->m_depth;
    ON_UuidList::operator=(&pOVar2->m_object_id_list,&pOVar1->m_object_id_list);
    pOVar2->m_is_exclusion_list = pOVar1->m_is_exclusion_list;
    ON_SimpleArray<int>::operator=(&pOVar2->m_layer_list,&pOVar1->m_layer_list);
    pOVar2->m_layer_list_is_sorted = pOVar1->m_layer_list_is_sorted;
    return this;
  }
  DeleteClippingPlaneData(this);
  return this;
}

Assistant:

ON_ClippingPlaneDataStore& ON_ClippingPlaneDataStore::operator=(const ON_ClippingPlaneDataStore& src)
{
  if (0==src.m_sn)
  {
    DeleteClippingPlaneData(*this);
  }
  else
  {
    ON_ClippingPlaneData* srcData = GetClippingPlaneData(src.m_sn);
    if (nullptr==srcData)
    {
      DeleteClippingPlaneData(*this);
    }
    else
    {
      ON_ClippingPlaneData* thisData = GetClippingPlaneData(*this, true);
      if (thisData)
      {
        thisData->m_depth = srcData->m_depth;
        thisData->m_object_id_list = srcData->m_object_id_list;
        thisData->m_is_exclusion_list = srcData->m_is_exclusion_list;
        thisData->m_layer_list = srcData->m_layer_list;
        thisData->m_layer_list_is_sorted = srcData->m_layer_list_is_sorted;
      }
    }
  }
  return *this;
}